

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O1

void google::protobuf::compiler::java::anon_unknown_8::SetPrimitiveVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,ClassNameResolver *name_resolver,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Context *context)

{
  slot_type *psVar1;
  uint8_t uVar2;
  ctrl_t *pcVar3;
  pointer pcVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 n;
  bool bVar7;
  Type TVar8;
  int iVar9;
  Nonnull<char_*> pcVar10;
  uint uVar11;
  OneofDescriptor *pOVar12;
  int bitIndex;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  undefined4 in_register_00000014;
  basic_string_view<char,_std::char_traits<char>_> *key;
  JavaType type;
  anon_union_8_1_a8a14541_for_iterator_2 aVar13;
  anon_union_8_1_a8a14541_for_iterator_2 aVar14;
  anon_union_8_1_a8a14541_for_iterator_2 *options;
  AlphaNum *pAVar15;
  char *pcVar16;
  string_view sVar17;
  string_view input;
  string result;
  string name;
  string capitalized_type;
  anon_union_8_1_a8a14541_for_iterator_2 local_238;
  anon_union_8_1_a8a14541_for_iterator_2 local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [40];
  anon_union_8_1_a8a14541_for_iterator_2 local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  size_type sStack_1b8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b0;
  anon_union_8_1_a8a14541_for_iterator_2 local_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [48];
  undefined1 local_150 [16];
  undefined1 local_140 [40];
  char local_118 [20];
  uint local_104;
  ClassNameResolver *local_100;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> local_f8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&,_false>
  local_f0;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_e8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  local_104 = messageBitIndex;
  SetCommonFieldVariables
            (descriptor,(FieldGeneratorInfo *)CONCAT44(in_register_00000014,builderBitIndex),
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)name_resolver);
  local_1f8._32_8_ = descriptor;
  local_140._20_4_ = GetJavaType(descriptor);
  sVar17 = PrimitiveTypeName(local_140._20_4_);
  local_238.slot_ = (slot_type *)local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,sVar17._M_str,sVar17._M_str + sVar17._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [5])0x6e6c7a);
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_238);
  if (local_238.slot_ != (slot_type *)local_228) {
    operator_delete(local_238.slot_,local_228._0_8_ + 1);
  }
  sVar17 = BoxedPrimitiveTypeName(local_140._20_4_);
  local_238.slot_ = (slot_type *)local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,sVar17._M_str,sVar17._M_str + sVar17._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [11])"boxed_type");
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_238);
  if (local_238.slot_ != (slot_type *)local_228) {
    operator_delete(local_238.slot_,local_228._0_8_ + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [5])0x6e6c7a);
  local_238 = (anon_union_8_1_a8a14541_for_iterator_2)0xa;
  local_230.slot_ = (slot_type *)0x6330e5;
  local_228._0_8_ = (slot_type *)(local_228 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,*(long *)(local_180._8_8_ + 0x10),
             *(long *)(local_180._8_8_ + 0x18) + *(long *)(local_180._8_8_ + 0x10));
  options = &local_1b0;
  local_208._0_8_ = name_resolver;
  local_1b0.slot_ = (slot_type *)&local_238;
  local_1a8.slot_ = (slot_type *)local_228;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),local_208,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_238,
             (piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)options,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)&local_1a8);
  if ((slot_type *)local_228._0_8_ != (slot_type *)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
  }
  local_80._0_4_ =
       *(undefined4 *)
        &variables[2].
         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_;
  local_80._4_2_ =
       *(undefined2 *)
        ((long)&variables[2].
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ + 4);
  pcVar3 = variables[2].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,
             pcVar3 + *(long *)((long)&variables[2].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  pcVar3 = variables[3].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,
             pcVar3 + *(long *)((long)&variables[3].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  local_38 = *(undefined2 *)
              &variables[4].
               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_;
  ImmutableDefaultValue_abi_cxx11_
            ((string *)&local_238,(java *)local_1f8._32_8_,(FieldDescriptor *)info,
             (ClassNameResolver *)local_80,(Options *)options);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[8]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [8])0x65639a);
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_238);
  if (local_238.slot_ != (slot_type *)local_228) {
    operator_delete(local_238.slot_,(ulong)(local_228._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  local_d0._0_4_ =
       *(undefined4 *)
        &variables[2].
         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .settings_.
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_;
  local_d0._4_2_ =
       *(undefined2 *)
        ((long)&variables[2].
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.size_ + 4);
  pcVar3 = variables[2].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + *(long *)((long)&variables[2].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  pcVar3 = variables[3].
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  local_a8._M_p = (pointer)&local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar3,
             pcVar3 + *(long *)((long)&variables[3].
                                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .
                                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8));
  local_88 = *(undefined2 *)
              &variables[4].
               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_;
  sVar17 = GetCapitalizedType((FieldDescriptor *)local_1f8._32_8_,true,(Options *)local_d0);
  local_238.slot_ = (slot_type *)local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,sVar17._M_str,sVar17._M_str + sVar17._M_len);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)(local_1a0 + 0x20),name_resolver,(char (*) [17])"capitalized_type");
  std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_238);
  if (local_238.slot_ != (slot_type *)local_228) {
    operator_delete(local_238.slot_,(ulong)(local_228._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p != &local_98) {
    operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
  }
  uVar6 = local_1f8._32_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  iVar9 = *(int *)(uVar6 + 4);
  bVar7 = FieldDescriptor::is_packed((FieldDescriptor *)uVar6);
  uVar11 = 2;
  if (!bVar7) {
    uVar11 = *(uint *)(protobuf::internal::WireFormatLite::kWireTypeForFieldType +
                      (ulong)*(uint8_t *)(local_1f8._32_8_ + 2) * 4);
  }
  pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                      (iVar9 << 3 | uVar11,(Nonnull<char_*>)local_228);
  local_238.slot_ = (slot_type *)(pcVar10 + -(long)local_228);
  pvVar5 = (void *)((long)local_180 + 0x10);
  local_230.slot_ = (slot_type *)local_228;
  local_180._0_8_ = pvVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_1a0 + 0x20),(slot_type *)local_228,pcVar10);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[4]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1b0,name_resolver,(char (*) [4])0x5d574c);
  std::__cxx11::string::operator=
            ((string *)((long)local_1a8.slot_ + 0x10),(string *)(local_1a0 + 0x20));
  uVar6 = local_1f8._32_8_;
  if ((void *)local_180._0_8_ != pvVar5) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  iVar9 = *(int *)(uVar6 + 4);
  TVar8 = GetType((FieldDescriptor *)uVar6);
  uVar11 = iVar9 * 8 + 1;
  iVar9 = 0x1f;
  if (uVar11 != 0) {
    for (; uVar11 >> iVar9 == 0; iVar9 = iVar9 + -1) {
    }
  }
  pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                      ((ulong)(iVar9 * 9 + 0x49U >> 6) << (TVar8 == TYPE_GROUP),
                       (Nonnull<char_*>)local_228);
  local_238.slot_ = (slot_type *)(pcVar10 + -(long)local_228);
  local_230.slot_ = (slot_type *)local_228;
  local_180._0_8_ = pvVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_1a0 + 0x20),(slot_type *)local_228,pcVar10);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_1b0,name_resolver,(char (*) [9])"tag_size");
  std::__cxx11::string::operator=
            ((string *)((long)local_1a8.slot_ + 0x10),(string *)(local_1a0 + 0x20));
  if ((void *)local_180._0_8_ != pvVar5) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  bVar7 = FieldDescriptor::is_required((FieldDescriptor *)uVar6);
  pcVar16 = "false";
  if (bVar7) {
    pcVar16 = "true";
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[9]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_238,name_resolver,(char (*) [9])0x7266ab);
  pAVar15 = (AlphaNum *)((ulong)bVar7 ^ 5);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_230.slot_ + 0x10),0,*(char **)((long)local_230.slot_ + 0x18),
             (ulong)pcVar16);
  type = local_140._20_4_;
  sVar17 = PrimitiveTypeName(local_140._20_4_);
  input._M_len = sVar17._M_str;
  input._M_str = (char *)0x1;
  UnderscoresToCamelCase_abi_cxx11_
            ((string *)(local_140 + 0x18),(java *)sVar17._M_len,input,SUB81(pAVar15,0));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_238,name_resolver,(char (*) [5])0x7203be);
  local_150._0_8_ = local_140;
  pcVar4 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)local_230.slot_ + 0x10))->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,pcVar4,pcVar4 + *(size_type *)((long)local_230.slot_ + 0x18));
  if (type < JAVATYPE_STRING) {
    local_238.slot_ = (slot_type *)&DAT_0000001d;
    local_230.slot_ = (slot_type *)0x63f7c2;
    local_180._0_8_ = local_140._32_8_;
    local_180._8_8_ = local_140._24_8_;
    local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)0x4;
    local_1a8.slot_ = (slot_type *)0x558c41;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar15);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [16])"field_list_type");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    psVar1 = (slot_type *)(local_208 + 0x10);
    if ((slot_type *)local_208._0_8_ != psVar1) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
    }
    local_238.slot_ = (slot_type *)&DAT_00000005;
    local_230.slot_ = (slot_type *)0x6eba52;
    local_180._0_8_ = local_140._32_8_;
    local_180._8_8_ = local_140._24_8_;
    local_1b0.slot_ = (slot_type *)&DAT_00000006;
    local_1a8.slot_ = (slot_type *)0x64d77d;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar15);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [11])"empty_list");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    if ((slot_type *)local_208._0_8_ != psVar1) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
    }
    local_238.slot_ = (slot_type *)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = 0x11;
    local_180._8_8_ = "_.makeImmutable()";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_150._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_208,name_resolver,(char (*) [23])"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)(local_208._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_238.slot_ = (slot_type *)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.get";
    local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._32_8_;
    local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._24_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar15);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [13])"repeated_get");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    if ((slot_type *)local_208._0_8_ != psVar1) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
    }
    local_238 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.add";
    local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._32_8_;
    local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._24_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar15);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [13])"repeated_add");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    if ((slot_type *)local_208._0_8_ != psVar1) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
    }
    local_238 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.set";
    local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._32_8_;
    local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2)local_140._24_8_;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar15);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [13])"repeated_set");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    if ((slot_type *)local_208._0_8_ != psVar1) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [11])"visit_type");
    std::__cxx11::string::_M_assign((string *)((long)local_230.slot_ + 0x10));
    local_238.slot_ = (slot_type *)&DAT_00000005;
    local_230.slot_ = (slot_type *)0x64be58;
    local_180._0_8_ = local_140._32_8_;
    local_180._8_8_ = local_140._24_8_;
    local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)0x4;
    local_1a8.slot_ = (slot_type *)0x558c41;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)&local_1b0,pAVar15);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [16])"visit_type_list");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    if ((slot_type *)local_208._0_8_ != psVar1) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
    }
  }
  else {
    local_180._0_8_ = 0x2a;
    local_180._8_8_ = "com.google.protobuf.Internal.ProtobufList<";
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_208,name_resolver,(char (*) [11])"boxed_type");
    local_1a8 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_208._8_8_ + 0x10);
    local_1b0 = *(anon_union_8_1_a8a14541_for_iterator_2 *)(local_208._8_8_ + 0x18);
    local_208._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
    local_208._8_8_ = (long)" >" + 1;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1d0,(lts_20250127 *)(local_1a0 + 0x20),(AlphaNum *)&local_1b0,
               (AlphaNum *)local_208,pAVar15);
    local_238 = (anon_union_8_1_a8a14541_for_iterator_2)0xf;
    local_230.slot_ = (slot_type *)0x63f7e0;
    local_228._0_8_ = local_228 + 0x10;
    if (local_1d0.slot_ == (slot_type *)&local_1c0) {
      local_218._8_8_ = sStack_1b8;
    }
    else {
      local_228._0_8_ = local_1d0;
    }
    local_218._1_7_ = uStack_1bf;
    local_218[0] = local_1c0;
    local_228._8_8_ = local_1c8;
    local_1c8 = (char *)0x0;
    local_1c0 = 0;
    local_f0._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
    local_1d0.slot_ = (slot_type *)&local_1c0;
    local_100 = name_resolver;
    local_f8.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>.
    super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>)
                   (_Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>)
                   &local_238;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::EmplaceDecomposable::operator()
              (&local_e8,local_118 + 0x18,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_238,
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)(local_118 + 0x20)
               ,(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                 *)&local_f0);
    if ((slot_type *)local_228._0_8_ != (slot_type *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
    }
    if (local_1d0.slot_ != (slot_type *)&local_1c0) {
      operator_delete(local_1d0.slot_,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [11])"empty_list");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_230.slot_ + 0x10),0,*(char **)((long)local_230.slot_ + 0x18),
               0x64d770);
    local_238.slot_ = (slot_type *)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = 0x11;
    local_180._8_8_ = "_.makeImmutable()";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_150._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_208,name_resolver,(char (*) [23])"make_name_unmodifiable");
    std::__cxx11::string::operator=((string *)(local_208._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_238.slot_ = (slot_type *)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.get";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_150._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_208,name_resolver,(char (*) [13])"repeated_get");
    std::__cxx11::string::operator=((string *)(local_208._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_238.slot_ = (slot_type *)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.add";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_150._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_208,name_resolver,(char (*) [13])"repeated_add");
    std::__cxx11::string::operator=((string *)(local_208._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    local_238.slot_ = (slot_type *)local_150._8_8_;
    local_230 = (anon_union_8_1_a8a14541_for_iterator_2)local_150._0_8_;
    local_180._0_8_ = &DAT_00000005;
    local_180._8_8_ = "_.set";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_150._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[13]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_208,name_resolver,(char (*) [13])"repeated_set");
    std::__cxx11::string::operator=((string *)(local_208._8_8_ + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [11])"visit_type");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_230.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,0x54fb09);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[16]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [16])"visit_type_list");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_230.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,0x64be99);
  }
  n = local_150._8_8_;
  uVar6 = local_150._0_8_;
  if (type == JAVATYPE_BYTES) {
    local_208._8_8_ = (slot_type *)0x0;
    local_1f8[0] = '\0';
    local_208._0_8_ = (slot_type *)(local_208 + 0x10);
    std::__cxx11::string::resize((ulong)local_208,(char)local_150._8_8_);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)local_208._0_8_,(Nullable<const_char_*>)uVar6,n);
    local_238.slot_ = (slot_type *)local_208._8_8_;
    local_230.slot_ = (slot_type *)local_208._0_8_;
    local_180._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0xe;
    local_180._8_8_ = "_DEFAULT_VALUE";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_208._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [14])"bytes_default");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)&local_1b0);
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
    }
    type = local_140._20_4_;
    if ((slot_type *)local_208._0_8_ != (slot_type *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
      type = local_140._20_4_;
    }
  }
  bVar7 = IsReferenceType(type);
  if (bVar7) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [11])0x6345d9);
    pcVar16 = "  java.lang.Class<?> valueClass = value.getClass();\n";
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [11])0x6345d9);
    pcVar16 = "";
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_230.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,(ulong)pcVar16);
  bVar7 = ((*(FieldOptions **)(local_1f8._32_8_ + 0x38))->field_0)._impl_.deprecated_;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[12]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_238,name_resolver,(char (*) [12])0x64d889);
  pcVar16 = "";
  if (bVar7 != false) {
    pcVar16 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_230.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,(ulong)pcVar16);
  TVar8 = GetType((FieldDescriptor *)local_1f8._32_8_);
  uVar11 = local_104;
  iVar9 = FixedSize(TVar8);
  if (iVar9 != -1) {
    pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        (iVar9,(Nonnull<char_*>)local_228);
    local_238.slot_ = (slot_type *)(pcVar10 + -(long)local_228);
    local_180._0_8_ = (long)local_180 + 0x10;
    local_230.slot_ = (slot_type *)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_1a0 + 0x20),(slot_type *)local_228,pcVar10);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[11]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1b0,name_resolver,(char (*) [11])"fixed_size");
    std::__cxx11::string::operator=
              ((string *)((long)local_1a8.slot_ + 0x10),(string *)(local_1a0 + 0x20));
    if ((slot_type *)local_180._0_8_ != (slot_type *)((long)local_180 + 0x10U)) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
  }
  bVar7 = FieldDescriptor::has_presence((FieldDescriptor *)local_1f8._32_8_);
  if (bVar7) {
    if ((*(undefined1 *)(local_1f8._32_8_ + 3) & 1) != 0) {
      if ((*(undefined1 *)(local_1f8._32_8_ + 1) & 0x10) == 0) {
        pOVar12 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar12 = ((anon_union_8_2_2904990b_for_scope_ *)(local_1f8._32_8_ + 0x28))->
                  containing_oneof;
        if (pOVar12 == (OneofDescriptor *)0x0) {
          iVar9 = 0xb31;
          goto LAB_00349451;
        }
      }
      if (pOVar12 == (OneofDescriptor *)0x0) {
        iVar9 = 0xb63;
LAB_00349451:
        protobuf::internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,iVar9);
      }
      if ((pOVar12->field_count_ == 1) && ((pOVar12->fields_->field_0x1 & 2) != 0)) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_238,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb64,"!res->is_synthetic()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_238);
      }
      if ((*(undefined1 *)(local_1f8._32_8_ + 3) & 1) != 0) goto LAB_00348e6f;
    }
    GenerateSetBit_abi_cxx11_((string *)local_208,(java *)(ulong)uVar11,bitIndex);
    local_238.slot_ = (slot_type *)local_208._8_8_;
    local_230.slot_ = (slot_type *)local_208._0_8_;
    local_180._0_8_ = 1;
    local_180._8_8_ = ";";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_208._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[26]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [26])"set_has_field_bit_message");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)&local_1b0);
    iVar9 = extraout_EDX;
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
      iVar9 = extraout_EDX_00;
    }
    if ((slot_type *)local_208._0_8_ != (slot_type *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
      iVar9 = extraout_EDX_01;
    }
    GenerateClearBit_abi_cxx11_((string *)local_208,(java *)(ulong)uVar11,iVar9);
    local_238.slot_ = (slot_type *)local_208._8_8_;
    local_230.slot_ = (slot_type *)local_208._0_8_;
    local_180._0_8_ = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
    local_180._8_8_ = ";";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_1b0,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
               (AlphaNum *)local_208._8_8_);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[28]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_1d0,name_resolver,(char (*) [28])"clear_has_field_bit_message");
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)&local_1b0);
    iVar9 = extraout_EDX_02;
    if (local_1b0.slot_ != (slot_type *)local_1a0) {
      operator_delete(local_1b0.slot_,local_1a0._0_8_ + 1);
      iVar9 = extraout_EDX_03;
    }
    if ((slot_type *)local_208._0_8_ != (slot_type *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,CONCAT71(local_1f8._1_7_,local_1f8[0]) + 1);
      iVar9 = extraout_EDX_04;
    }
    GenerateGetBit_abi_cxx11_((string *)&local_238,(java *)(ulong)uVar11,iVar9);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)(local_1a0 + 0x20),name_resolver,(char (*) [25])"is_field_present_message");
    std::__cxx11::string::operator=((string *)(local_180._8_8_ + 0x10),(string *)&local_238);
    aVar13 = (anon_union_8_1_a8a14541_for_iterator_2)local_228._0_8_;
    aVar14 = local_238;
    if (local_238.slot_ == (slot_type *)local_228) goto LAB_00349372;
  }
  else {
LAB_00348e6f:
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[26]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [26])"set_has_field_bit_message");
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_230.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,0x50989c);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[28]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_238,name_resolver,(char (*) [28])"clear_has_field_bit_message");
    pAVar15 = (AlphaNum *)0x0;
    std::__cxx11::string::_M_replace
              ((ulong)((long)local_230.slot_ + 0x10),0,
               (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,0x50989c);
    uVar2 = *(uint8_t *)(local_1f8._32_8_ + 2);
    if (uVar2 == '\x01') {
      local_238 = (anon_union_8_1_a8a14541_for_iterator_2)0x25;
      local_230.slot_ = (slot_type *)0x6401b7;
      local_180._0_8_ = local_150._8_8_;
      local_180._8_8_ = local_150._0_8_;
      local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)0x7;
      local_1a8.slot_ = (slot_type *)0x64bf01;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)&local_1b0,pAVar15);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[25]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [25])"is_field_present_message");
    }
    else if (uVar2 == '\x02') {
      local_238 = (anon_union_8_1_a8a14541_for_iterator_2)0x22;
      local_230.slot_ = (slot_type *)0x640194;
      local_180._0_8_ = local_150._8_8_;
      local_180._8_8_ = local_150._0_8_;
      local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)0x7;
      local_1a8.slot_ = (slot_type *)0x64bf01;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)&local_1b0,pAVar15);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[25]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [25])"is_field_present_message");
    }
    else {
      if (uVar2 != '\f') {
        local_180._0_8_ = local_150._8_8_;
        local_180._8_8_ = local_150._0_8_;
        local_1b0.slot_ = (slot_type *)&DAT_00000005;
        local_1a8.slot_ = (slot_type *)0x64bf09;
        absl::lts_20250127::container_internal::
        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::try_emplace_impl<char_const(&)[8]>(&local_e8,name_resolver,(char (*) [8])0x65639a);
        local_208._8_8_ = *(undefined8 *)((long)local_e8.first.field_1.slot_ + 0x10);
        local_208._0_8_ =
             *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)local_e8.first.field_1.slot_ + 0x18);
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)&local_1d0,(lts_20250127 *)(local_1a0 + 0x20),(AlphaNum *)&local_1b0,
                   (AlphaNum *)local_208,pAVar15);
        local_238 = (anon_union_8_1_a8a14541_for_iterator_2)0x18;
        local_230.slot_ = (slot_type *)0x63d5b5;
        local_228._0_8_ = local_228 + 0x10;
        if (local_1d0.slot_ == (slot_type *)&local_1c0) {
          local_218._8_8_ = sStack_1b8;
        }
        else {
          local_228._0_8_ = local_1d0;
        }
        local_218._1_7_ = uStack_1bf;
        local_218[0] = local_1c0;
        local_228._8_8_ = local_1c8;
        local_1c8 = (char *)0x0;
        local_1c0 = 0;
        local_f0._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
        local_1d0.slot_ = (slot_type *)&local_1c0;
        local_100 = name_resolver;
        local_f8.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>.
        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false>.
        _M_head_impl = (_Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>)
                       (_Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>)
                       &local_238;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
        ::EmplaceDecomposable::operator()
                  (&local_e8,local_118 + 0x18,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_238,
                   (piecewise_construct_t *)&std::piecewise_construct,
                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *)
                   (local_118 + 0x20),
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                    *)&local_f0);
        if ((slot_type *)local_228._0_8_ != (slot_type *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1));
        }
        if (local_1d0.slot_ == (slot_type *)&local_1c0) goto LAB_00349372;
        aVar13._1_7_ = uStack_1bf;
        aVar13._0_1_ = local_1c0;
        aVar14 = local_1d0;
        goto LAB_0034936a;
      }
      local_238 = (anon_union_8_1_a8a14541_for_iterator_2)0x1;
      local_230.slot_ = (slot_type *)0x7140b7;
      local_180._0_8_ = local_150._8_8_;
      local_180._8_8_ = local_150._0_8_;
      local_1b0 = (anon_union_8_1_a8a14541_for_iterator_2)0xb;
      local_1a8.slot_ = (slot_type *)0x64bef5;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_208,(lts_20250127 *)&local_238,(AlphaNum *)(local_1a0 + 0x20),
                 (AlphaNum *)&local_1b0,pAVar15);
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
      ::try_emplace_impl<char_const(&)[25]>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_1d0,name_resolver,(char (*) [25])"is_field_present_message");
    }
    std::__cxx11::string::operator=((string *)(local_1c8 + 0x10),(string *)local_208);
    if ((slot_type *)local_208._0_8_ == (slot_type *)(local_208 + 0x10)) goto LAB_00349372;
    aVar13._1_7_ = local_1f8._1_7_;
    aVar13._0_1_ = local_1f8[0];
    aVar14 = (anon_union_8_1_a8a14541_for_iterator_2)local_208._0_8_;
  }
LAB_0034936a:
  operator_delete(aVar14.slot_,(ulong)((long)aVar13.slot_ + 1));
LAB_00349372:
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[2]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_238,name_resolver,(char (*) [2])0x5752de);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_230.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,0x50989c);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[2]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_238,name_resolver,(char (*) [2])0x64e2bd);
  std::__cxx11::string::_M_replace
            ((ulong)((long)local_230.slot_ + 0x10),0,
             (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_230.slot_ + 0x18))->_M_allocated_capacity,0x50989c);
  if ((slot_type *)local_150._0_8_ != (slot_type *)local_140) {
    operator_delete((void *)local_150._0_8_,local_140._0_8_ + 1);
  }
  if ((char *)local_140._24_8_ != local_118) {
    operator_delete((void *)local_140._24_8_,local_118._0_8_ + 1);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(
    const FieldDescriptor* descriptor, int messageBitIndex, int builderBitIndex,
    const FieldGeneratorInfo* info, ClassNameResolver* name_resolver,
    absl::flat_hash_map<absl::string_view, std::string>* variables,
    Context* context) {
  SetCommonFieldVariables(descriptor, info, variables);

  (*variables)["empty_list"] =
      "com.google.protobuf.GeneratedMessageLite.emptyProtobufList()";

  (*variables)["default"] =
      ImmutableDefaultValue(descriptor, name_resolver, context->options());
  (*variables)["default_init"] = absl::StrCat(
      "= ",
      ImmutableDefaultValue(descriptor, name_resolver, context->options()));
  (*variables)["capitalized_type"] = "java.lang.String";
  (*variables)["tag"] =
      absl::StrCat(static_cast<int32_t>(WireFormat::MakeTag(descriptor)));
  (*variables)["tag_size"] = absl::StrCat(
      WireFormat::TagSize(descriptor->number(), GetType(descriptor)));

  // TODO: Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] =
      descriptor->options().deprecated() ? "@java.lang.Deprecated " : "";
  (*variables)["required"] = descriptor->is_required() ? "true" : "false";
  if (!context->options().opensource_runtime) {
    (*variables)["enforce_utf8"] = CheckUtf8(descriptor) ? "true" : "false";
  }

  if (HasHasbit(descriptor)) {
    if (!context->options().opensource_runtime) {
      (*variables)["bit_field_id"] = absl::StrCat(messageBitIndex / 32);
      (*variables)["bit_field_name"] = GetBitFieldNameForBit(messageBitIndex);
      (*variables)["bit_field_mask"] =
          absl::StrCat(1 << (messageBitIndex % 32));
    }
    // For singular messages and builders, one bit is used for the hasField bit.
    // Note that these have a trailing ";".
    (*variables)["set_has_field_bit_message"] =
        absl::StrCat(GenerateSetBit(messageBitIndex), ";");
    (*variables)["clear_has_field_bit_message"] =
        absl::StrCat(GenerateClearBit(messageBitIndex), ";");

    (*variables)["is_field_present_message"] = GenerateGetBit(messageBitIndex);
  } else {
    (*variables)["set_has_field_bit_message"] = "";
    (*variables)["clear_has_field_bit_message"] = "";

    variables->insert({"is_field_present_message",
                       absl::StrCat("!", (*variables)["name"], "_.isEmpty()")});
  }

  // Annotations often use { and } variables to denote text ranges.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
}